

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void __thiscall TestArgsBase::~TestArgsBase(TestArgsBase *this)

{
  this->_vptr_TestArgsBase = (_func_int **)&PTR__TestArgsBase_00110be0;
  std::_Function_base::~_Function_base(&(this->testFunction).super__Function_base);
  std::__cxx11::string::~string((string *)&this->testName);
  return;
}

Assistant:

virtual ~TestArgsBase() { }